

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

bool __thiscall
Debugger::HandleDebugEvent(Debugger *this,JsDiagDebugEvent debugEvent,JsValueRef eventData)

{
  JsErrorCode jsErrorCode_00;
  PAL_FILE *pPVar1;
  LPCWSTR pWVar2;
  JsValueRef pvStack_30;
  JsErrorCode jsErrorCode;
  JsValueRef debugEventRef;
  JsValueRef eventData_local;
  Debugger *pDStack_18;
  JsDiagDebugEvent debugEvent_local;
  Debugger *this_local;
  
  debugEventRef = eventData;
  eventData_local._4_4_ = debugEvent;
  pDStack_18 = this;
  jsErrorCode_00 = ChakraRTInterface::JsDoubleToNumber((double)debugEvent,&stack0xffffffffffffffd0);
  if (jsErrorCode_00 == JsNoError) {
    this_local._7_1_ = CallFunctionNoResult(this,"HandleDebugEvent",pvStack_30,debugEventRef);
  }
  else {
    pPVar1 = PAL_get_stderr(0);
    pWVar2 = Helpers::JsErrorCodeToString(jsErrorCode_00);
    PAL_fwprintf(pPVar1,
                 L"ERROR: ChakraRTInterface::JsDoubleToNumber(debugEvent, &debugEventRef) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)jsErrorCode_00,pWVar2);
    pPVar1 = PAL_get_stderr(0);
    PAL_fflush(pPVar1);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Debugger::HandleDebugEvent(JsDiagDebugEvent debugEvent, JsValueRef eventData)
{
    JsValueRef debugEventRef;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsDoubleToNumber(debugEvent, &debugEventRef));

    return this->CallFunctionNoResult("HandleDebugEvent", debugEventRef, eventData);
}